

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O2

CURLcode Curl_dynhds_add(dynhds *dynhds,char *name,size_t namelen,char *value,size_t valuelen)

{
  long lVar1;
  uint uVar2;
  CURLcode CVar3;
  dynhds_entry *pdVar4;
  ulong uVar5;
  dynhds_entry **__dest;
  size_t sVar6;
  ulong uVar7;
  char *__dest_00;
  ulong uVar8;
  
  if ((dynhds->max_entries != 0) && (dynhds->max_entries <= dynhds->hds_len)) {
    return CURLE_OUT_OF_MEMORY;
  }
  lVar1 = valuelen + namelen;
  if (dynhds->max_strs_size < dynhds->strs_len + lVar1) {
    return CURLE_OUT_OF_MEMORY;
  }
  uVar2 = dynhds->opts;
  pdVar4 = (dynhds_entry *)(*Curl_ccalloc)(1,lVar1 + 0x22);
  if (pdVar4 == (dynhds_entry *)0x0) {
LAB_0012314c:
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    pdVar4->name = (char *)(pdVar4 + 1);
    memcpy(pdVar4 + 1,name,namelen);
    pdVar4->namelen = namelen;
    __dest_00 = (char *)((long)&pdVar4[1].name + namelen + 1);
    pdVar4->value = __dest_00;
    memcpy(__dest_00,value,valuelen);
    pdVar4->valuelen = valuelen;
    if ((uVar2 & 1) != 0) {
      Curl_strntolower(pdVar4->name,pdVar4->name,pdVar4->namelen);
    }
    sVar6 = dynhds->hds_len;
    uVar7 = sVar6 + 1;
    if (uVar7 < dynhds->hds_allc) {
      __dest = dynhds->hds;
    }
    else {
      uVar5 = sVar6 + 0x10;
      uVar7 = dynhds->max_entries;
      uVar8 = uVar7;
      if (uVar5 < uVar7) {
        uVar8 = uVar5;
      }
      if (uVar7 == 0) {
        uVar8 = uVar5;
      }
      __dest = (dynhds_entry **)(*Curl_ccalloc)(uVar8,8);
      if (__dest == (dynhds_entry **)0x0) {
        (*Curl_cfree)(pdVar4);
        goto LAB_0012314c;
      }
      if (dynhds->hds != (dynhds_entry **)0x0) {
        memcpy(__dest,dynhds->hds,dynhds->hds_len << 3);
        (*Curl_cfree)(dynhds->hds);
      }
      dynhds->hds = __dest;
      dynhds->hds_allc = uVar8;
      sVar6 = dynhds->hds_len;
      uVar7 = sVar6 + 1;
    }
    dynhds->hds_len = uVar7;
    __dest[sVar6] = pdVar4;
    dynhds->strs_len = dynhds->strs_len + lVar1;
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

CURLcode Curl_dynhds_add(struct dynhds *dynhds,
                         const char *name, size_t namelen,
                         const char *value, size_t valuelen)
{
  struct dynhds_entry *entry = NULL;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  DEBUGASSERT(dynhds);
  if(dynhds->max_entries && dynhds->hds_len >= dynhds->max_entries)
    return CURLE_OUT_OF_MEMORY;
  if(dynhds->strs_len + namelen + valuelen > dynhds->max_strs_size)
    return CURLE_OUT_OF_MEMORY;

entry = entry_new(name, namelen, value, valuelen, dynhds->opts);
  if(!entry)
    goto out;

  if(dynhds->hds_len + 1 >= dynhds->hds_allc) {
    size_t nallc = dynhds->hds_len + 16;
    struct dynhds_entry **nhds;

    if(dynhds->max_entries && nallc > dynhds->max_entries)
      nallc = dynhds->max_entries;

    nhds = calloc(nallc, sizeof(struct dynhds_entry *));
    if(!nhds)
      goto out;
    if(dynhds->hds) {
      memcpy(nhds, dynhds->hds,
             dynhds->hds_len * sizeof(struct dynhds_entry *));
      Curl_safefree(dynhds->hds);
    }
    dynhds->hds = nhds;
    dynhds->hds_allc = nallc;
  }
  dynhds->hds[dynhds->hds_len++] = entry;
  entry = NULL;
  dynhds->strs_len += namelen + valuelen;
  result = CURLE_OK;

out:
  if(entry)
    entry_free(entry);
  return result;
}